

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O3

void __thiscall comparer_context::cmp_bounds<aiQuatKey>(comparer_context *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_58;
  aiQuatKey local_38;
  
  paVar1 = &local_58.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  cmp<aiQuatKey>(&local_38,this,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (name->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  cmp<aiQuatKey>(&local_38,this,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmp_bounds(const std::string& name) {
        cmp<T> (name+".<minimum-value>");
        cmp<T> (name+".<maximum-value>");
    }